

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryDecoder.cc
# Opt level: O3

int64_t __thiscall avro::BinaryDecoder::doDecodeLong(BinaryDecoder *this)

{
  byte *pbVar1;
  int64_t iVar2;
  undefined8 *puVar3;
  ulong input;
  ulong uVar4;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  uVar4 = 0;
  input = 0;
  do {
    if (0x3f < uVar4) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Invalid Avro varint","");
      std::runtime_error::runtime_error((runtime_error *)(puVar3 + 1),(string *)local_48);
      *puVar3 = 0x17fa60;
      puVar3[1] = 0x17fa90;
      __cxa_throw(puVar3,&Exception::typeinfo,Exception::~Exception);
    }
    pbVar1 = (this->in_).next_;
    if (pbVar1 == (this->in_).end_) {
      StreamReader::more(&this->in_);
      pbVar1 = (this->in_).next_;
    }
    (this->in_).next_ = pbVar1 + 1;
    input = input | (ulong)(*pbVar1 & 0x7f) << ((byte)uVar4 & 0x3f);
    uVar4 = uVar4 + 7;
  } while ((char)*pbVar1 < '\0');
  iVar2 = decodeZigzag64(input);
  return iVar2;
}

Assistant:

int64_t BinaryDecoder::doDecodeLong() {
    uint64_t encoded = 0;
    int shift = 0;
    uint8_t u;
    do {
        if (shift >= 64) {
            throw Exception("Invalid Avro varint");
        }
        u = in_.read();
        encoded |= static_cast<uint64_t>(u & 0x7f) << shift;
        shift += 7;
    } while (u & 0x80);

    return decodeZigzag64(encoded);
}